

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int blobReadWrite(sqlite3_blob *pBlob,void *z,int n,int iOffset,
                 _func_int_BtCursor_ptr_u32_u32_void_ptr *xCall)

{
  sqlite3 *db_00;
  Vdbe *p_00;
  sqlite3 *db;
  Vdbe *v;
  Incrblob *p;
  int rc;
  _func_int_BtCursor_ptr_u32_u32_void_ptr *xCall_local;
  int iOffset_local;
  int n_local;
  void *z_local;
  sqlite3_blob *pBlob_local;
  
  if (pBlob == (sqlite3_blob *)0x0) {
    pBlob_local._4_4_ = sqlite3MisuseError(0x18240);
  }
  else {
    db_00 = *(sqlite3 **)(pBlob + 0x20);
    sqlite3_mutex_enter(db_00->mutex);
    p_00 = *(Vdbe **)(pBlob + 0x18);
    if (((n < 0) || (iOffset < 0)) || ((long)*(int *)pBlob < (long)iOffset + (long)n)) {
      p._4_4_ = 1;
    }
    else if (p_00 == (Vdbe *)0x0) {
      p._4_4_ = 4;
    }
    else {
      sqlite3BtreeEnterCursor(*(BtCursor **)(pBlob + 0x10));
      p._4_4_ = (*xCall)(*(BtCursor **)(pBlob + 0x10),iOffset + *(int *)(pBlob + 4),n,z);
      sqlite3BtreeLeaveCursor(*(BtCursor **)(pBlob + 0x10));
      if (p._4_4_ == 4) {
        sqlite3VdbeFinalize(p_00);
        *(undefined8 *)(pBlob + 0x18) = 0;
      }
      else {
        p_00->rc = p._4_4_;
      }
    }
    sqlite3Error(db_00,p._4_4_);
    pBlob_local._4_4_ = sqlite3ApiExit(db_00,p._4_4_);
    sqlite3_mutex_leave(db_00->mutex);
  }
  return pBlob_local._4_4_;
}

Assistant:

static int blobReadWrite(
  sqlite3_blob *pBlob,
  void *z,
  int n,
  int iOffset,
  int (*xCall)(BtCursor*, u32, u32, void*)
){
  int rc;
  Incrblob *p = (Incrblob *)pBlob;
  Vdbe *v;
  sqlite3 *db;

  if( p==0 ) return SQLITE_MISUSE_BKPT;
  db = p->db;
  sqlite3_mutex_enter(db->mutex);
  v = (Vdbe*)p->pStmt;

  if( n<0 || iOffset<0 || ((sqlite3_int64)iOffset+n)>p->nByte ){
    /* Request is out of range. Return a transient error. */
    rc = SQLITE_ERROR;
  }else if( v==0 ){
    /* If there is no statement handle, then the blob-handle has
    ** already been invalidated. Return SQLITE_ABORT in this case.
    */
    rc = SQLITE_ABORT;
  }else{
    /* Call either BtreeData() or BtreePutData(). If SQLITE_ABORT is
    ** returned, clean-up the statement handle.
    */
    assert( db == v->db );
    sqlite3BtreeEnterCursor(p->pCsr);

#ifdef SQLITE_ENABLE_PREUPDATE_HOOK
    if( xCall==sqlite3BtreePutData && db->xPreUpdateCallback ){
      /* If a pre-update hook is registered and this is a write cursor,
      ** invoke it here.
      **
      ** TODO: The preupdate-hook is passed SQLITE_DELETE, even though this
      ** operation should really be an SQLITE_UPDATE. This is probably
      ** incorrect, but is convenient because at this point the new.* values
      ** are not easily obtainable. And for the sessions module, an
      ** SQLITE_UPDATE where the PK columns do not change is handled in the
      ** same way as an SQLITE_DELETE (the SQLITE_DELETE code is actually
      ** slightly more efficient). Since you cannot write to a PK column
      ** using the incremental-blob API, this works. For the sessions module
      ** anyhow.
      */
      sqlite3_int64 iKey;
      iKey = sqlite3BtreeIntegerKey(p->pCsr);
      assert( v->apCsr[0]!=0 );
      assert( v->apCsr[0]->eCurType==CURTYPE_BTREE );
      sqlite3VdbePreUpdateHook(
          v, v->apCsr[0], SQLITE_DELETE, p->zDb, p->pTab, iKey, -1, p->iCol
      );
    }
#endif

    rc = xCall(p->pCsr, iOffset+p->iOffset, n, z);
    sqlite3BtreeLeaveCursor(p->pCsr);
    if( rc==SQLITE_ABORT ){
      sqlite3VdbeFinalize(v);
      p->pStmt = 0;
    }else{
      v->rc = rc;
    }
  }
  sqlite3Error(db, rc);
  rc = sqlite3ApiExit(db, rc);
  sqlite3_mutex_leave(db->mutex);
  return rc;
}